

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_entry.c
# Opt level: O0

void archive_entry_set_birthtime(archive_entry *entry,time_t t,long ns)

{
  long local_20;
  long ns_local;
  time_t t_local;
  archive_entry *entry_local;
  
  ns_local = ns / 1000000000 + t;
  local_20 = ns % 1000000000;
  if (local_20 < 0) {
    ns_local = ns_local + -1;
    local_20 = local_20 + 1000000000;
  }
  entry->stat_valid = L'\0';
  entry->ae_set = entry->ae_set | 0x20;
  (entry->ae_stat).aest_birthtime = ns_local;
  (entry->ae_stat).aest_birthtime_nsec = (uint32_t)local_20;
  return;
}

Assistant:

void
archive_entry_set_birthtime(struct archive_entry *entry, time_t t, long ns)
{
	FIX_NS(t, ns);
	entry->stat_valid = 0;
	entry->ae_set |= AE_SET_BIRTHTIME;
	entry->ae_stat.aest_birthtime = t;
	entry->ae_stat.aest_birthtime_nsec = ns;
}